

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void TestSemanticAnalysis(char *test_file_name)

{
  SymbolQueue *pSVar1;
  compile_errcode cVar2;
  SymbolTableTree *pSVar3;
  PcodeGenerator *pPVar4;
  ostream *poVar5;
  allocator local_ab6;
  allocator local_ab5;
  SymbolType local_ab4;
  string local_ab0;
  string local_a90;
  Symbol symbol;
  LexicalAnalysis lexical_analysis;
  Program program;
  
  LexicalAnalysis::LexicalAnalysis(&lexical_analysis,test_file_name);
  if (lexical_analysis.fp_in == (FILE *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"bad file");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    symbol.m_value.string_value._M_dataplus._M_p = (pointer)&symbol.m_value.string_value.field_2;
    symbol.m_value.string_value._M_string_length = 0;
    symbol.m_value.string_value.field_2._M_local_buf[0] = '\0';
    handle_symbol_queue = (SymbolQueue *)operator_new(0x20);
    (handle_symbol_queue->m_symbol_queue).super__Vector_base<Symbol,_std::allocator<Symbol>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (handle_symbol_queue->m_symbol_queue).super__Vector_base<Symbol,_std::allocator<Symbol>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    handle_symbol_queue->m_current_locate = 0;
    handle_symbol_queue->m_cache_locate = 0;
    (handle_symbol_queue->m_symbol_queue).super__Vector_base<Symbol,_std::allocator<Symbol>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pSVar3 = (SymbolTableTree *)operator_new(0x60);
    SymbolTableTree::SymbolTableTree(pSVar3);
    symbol_table_tree = pSVar3;
    Program::Program(&program);
    pPVar4 = (PcodeGenerator *)operator_new(0x60);
    PcodeGenerator::PcodeGenerator(pPVar4,"pcode.txt");
    pcode_generator = pPVar4;
    do {
      cVar2 = LexicalAnalysis::GetSym(&lexical_analysis,&symbol);
      if (cVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "lexical analysys error, please run TestLexicalAnalysis to check");
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_00130018;
      }
      std::vector<Symbol,_std::allocator<Symbol>_>::push_back
                (&handle_symbol_queue->m_symbol_queue,&symbol);
    } while (symbol.m_name != EOF_SYM);
    poVar5 = std::operator<<((ostream *)&std::cout,"push over");
    std::endl<char,std::char_traits<char>>(poVar5);
    Program::Parse(&program);
    pSVar3 = symbol_table_tree;
    std::__cxx11::string::string((string *)&local_ab0,"global",&local_ab5);
    local_ab4 = VOID;
    std::__cxx11::string::string((string *)&local_a90,"end",&local_ab6);
    SymbolTableTree::InsertTable(pSVar3,&local_ab0,&local_ab4,&local_a90);
    std::__cxx11::string::~string((string *)&local_a90);
    std::__cxx11::string::~string((string *)&local_ab0);
    pSVar3 = symbol_table_tree;
    std::__cxx11::string::string((string *)&local_ab0,"global",(allocator *)&local_a90);
    std::__cxx11::string::_M_assign((string *)&pSVar3->current_table_name);
    std::__cxx11::string::~string((string *)&local_ab0);
    handle_correct_queue = handle_symbol_queue;
    SymbolQueue::Restart(handle_symbol_queue);
    Program::Action(&program);
    SymbolTableTree::PrintTree(symbol_table_tree);
LAB_00130018:
    pPVar4 = pcode_generator;
    if (pcode_generator != (PcodeGenerator *)0x0) {
      PcodeGenerator::~PcodeGenerator(pcode_generator);
    }
    operator_delete(pPVar4);
    pSVar3 = symbol_table_tree;
    if (symbol_table_tree != (SymbolTableTree *)0x0) {
      SymbolTableTree::~SymbolTableTree(symbol_table_tree);
    }
    operator_delete(pSVar3);
    pSVar1 = handle_symbol_queue;
    if (handle_symbol_queue != (SymbolQueue *)0x0) {
      std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&handle_symbol_queue->m_symbol_queue);
    }
    operator_delete(pSVar1);
    Program::~Program(&program);
    std::__cxx11::string::~string((string *)&symbol.m_value.string_value);
  }
  LexicalAnalysis::~LexicalAnalysis(&lexical_analysis);
  return;
}

Assistant:

void TestSemanticAnalysis(const char* test_file_name) {
    int ret = COMPILE_OK;
    LexicalAnalysis lexical_analysis(test_file_name);
    if (!lexical_analysis.CheckFile()) {
        std::cerr << "bad file" << endl;
        return;
    }
    Symbol symbol;
    handle_symbol_queue = new SymbolQueue;
    symbol_table_tree = new SymbolTableTree;
    Program program;
    pcode_generator = new PcodeGenerator("pcode.txt");
    while (true) {
        ret = lexical_analysis.GetSym(symbol);
        if (ret != COMPILE_OK) {
            std::cerr << "lexical analysys error, please run TestLexicalAnalysis to check" << endl;
            goto ERROR1;
        }
        handle_symbol_queue->PushSymbol(symbol);
        SymbolName name = symbol.GetName();
        if (name == EOF_SYM)
            break;
    }
    cout << "push over" << endl;
    program.Parse();
    symbol_table_tree->InsertTable(string("global"), VOID, string("end"));
    symbol_table_tree->SetCurrentTableName(string("global"));
    handle_correct_queue = handle_symbol_queue;
    handle_correct_queue->Restart();
    program.Action();
    symbol_table_tree->PrintTree();
ERROR1:
    delete(pcode_generator);
    delete(symbol_table_tree);
    delete(handle_symbol_queue);
}